

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

bool __thiscall Opcode::AABBNoLeafTree::Refit(AABBNoLeafTree *this,MeshInterface *mesh_interface)

{
  float fVar1;
  float fVar2;
  AABBNoLeafNode *pAVar3;
  int *piVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float local_5fc;
  float local_5f4;
  float local_5ec;
  float local_5e4;
  float local_5dc;
  float local_5d4;
  float local_5c8;
  float local_5c4;
  float local_5c0;
  float local_5b0;
  float local_5ac;
  float local_5a8;
  float local_5a4;
  float local_5a0;
  float local_59c;
  float local_598;
  float local_594;
  float local_590;
  float local_58c;
  float local_588;
  float local_584;
  float local_560;
  float local_55c;
  float local_558;
  float local_554;
  float local_550;
  float local_54c;
  float local_548;
  float local_544;
  float local_540;
  float local_53c;
  float local_538;
  float local_534;
  float local_530;
  float local_52c;
  float local_528;
  float local_524;
  float local_520;
  float local_51c;
  CollisionAABB *CurrentBox_1;
  CollisionAABB *CurrentBox;
  AABBNoLeafNode *Current;
  udword Index;
  Point Max_;
  Point Min_;
  undefined8 local_4b8;
  Point Max;
  Point Min;
  VertexPointers VP;
  MeshInterface *mesh_interface_local;
  AABBNoLeafTree *this_local;
  IndexedTriangle *T_1;
  IndexedTriangle *T;
  float local_3c4;
  float fStack_3c0;
  float local_3a4;
  float fStack_3a0;
  float local_384;
  float fStack_380;
  undefined8 local_364;
  undefined8 local_2f0;
  undefined8 local_2cc;
  
  if (mesh_interface == (MeshInterface *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    Current._0_4_ = (this->super_AABBOptimizedTree).mNbNodes;
    while ((uint)Current != 0) {
      pAVar3 = this->mNodes + ((uint)Current - 1);
      if ((pAVar3->mPosData & 1) == 0) {
        pfVar5 = (float *)pAVar3->mPosData;
        local_3a4 = *pfVar5 - pfVar5[3];
        fStack_3a0 = pfVar5[1] - pfVar5[4];
        Max.y = local_3a4;
        Max.z = fStack_3a0;
        Max.x = pfVar5[2] + pfVar5[5];
        local_364._0_4_ = *pfVar5 + pfVar5[3];
        local_364._4_4_ = pfVar5[1] + pfVar5[4];
        local_4b8 = local_364;
      }
      else {
        piVar4 = (int *)((long)mesh_interface->mTris->mVRef +
                        (ulong)((int)(pAVar3->mPosData >> 1) * mesh_interface->mTriStride));
        pfVar5 = (float *)((long)&mesh_interface->mVerts->x +
                          (ulong)(*piVar4 * mesh_interface->mVertexStride));
        pfVar6 = (float *)((long)&mesh_interface->mVerts->x +
                          (ulong)(piVar4[1] * mesh_interface->mVertexStride));
        pfVar7 = (float *)((long)&mesh_interface->mVerts->x +
                          (ulong)(piVar4[2] * mesh_interface->mVertexStride));
        fVar1 = *pfVar5;
        fVar2 = *pfVar6;
        local_524 = *pfVar7;
        if (fVar2 <= fVar1) {
          if (fVar2 < local_524) {
            local_524 = fVar2;
          }
          local_520 = local_524;
        }
        else {
          local_51c = local_524;
          if (fVar1 < local_524) {
            local_51c = fVar1;
          }
          local_520 = local_51c;
        }
        local_530 = *pfVar5;
        local_528 = *pfVar6;
        fVar1 = *pfVar7;
        if (local_528 <= local_530) {
          if (local_530 < fVar1) {
            local_530 = fVar1;
          }
          local_52c = local_530;
        }
        else {
          if (local_528 < fVar1) {
            local_528 = fVar1;
          }
          local_52c = local_528;
        }
        fVar1 = pfVar5[1];
        fVar2 = pfVar6[1];
        local_53c = pfVar7[1];
        if (fVar2 <= fVar1) {
          if (fVar2 < local_53c) {
            local_53c = fVar2;
          }
          local_538 = local_53c;
        }
        else {
          local_534 = local_53c;
          if (fVar1 < local_53c) {
            local_534 = fVar1;
          }
          local_538 = local_534;
        }
        Max.z = local_538;
        Max.y = local_520;
        local_548 = pfVar5[1];
        local_540 = pfVar6[1];
        fVar1 = pfVar7[1];
        if (local_540 <= local_548) {
          if (local_548 < fVar1) {
            local_548 = fVar1;
          }
          local_544 = local_548;
        }
        else {
          if (local_540 < fVar1) {
            local_540 = fVar1;
          }
          local_544 = local_540;
        }
        local_4b8 = CONCAT44(local_544,local_52c);
        fVar1 = pfVar5[2];
        fVar2 = pfVar6[2];
        local_554 = pfVar7[2];
        if (fVar2 <= fVar1) {
          if (fVar2 < local_554) {
            local_554 = fVar2;
          }
          local_550 = local_554;
        }
        else {
          local_54c = local_554;
          if (fVar1 < local_554) {
            local_54c = fVar1;
          }
          local_550 = local_54c;
        }
        Min.x = local_550;
        local_560 = pfVar5[2];
        local_558 = pfVar6[2];
        fVar1 = pfVar7[2];
        if (local_558 <= local_560) {
          if (local_560 < fVar1) {
            local_560 = fVar1;
          }
          local_55c = local_560;
        }
        else {
          if (local_558 < fVar1) {
            local_558 = fVar1;
          }
          local_55c = local_558;
        }
        Max.x = local_55c;
      }
      if ((pAVar3->mNegData & 1) == 0) {
        pfVar5 = (float *)pAVar3->mNegData;
        local_3c4 = *pfVar5 - pfVar5[3];
        fStack_3c0 = pfVar5[1] - pfVar5[4];
        Max_.z = (float)((ulong)_local_3c4 >> 0x20);
        Max_.y = (float)_local_3c4;
        Max_.x = pfVar5[2] + pfVar5[5];
        local_384 = *pfVar5 + pfVar5[3];
        fStack_380 = pfVar5[1] + pfVar5[4];
        Index = (udword)((ulong)_local_384 >> 0x20);
        Current._4_4_ = (float)_local_384;
      }
      else {
        piVar4 = (int *)((long)mesh_interface->mTris->mVRef +
                        (ulong)((int)(pAVar3->mNegData >> 1) * mesh_interface->mTriStride));
        pfVar5 = (float *)((long)&mesh_interface->mVerts->x +
                          (ulong)(*piVar4 * mesh_interface->mVertexStride));
        pfVar6 = (float *)((long)&mesh_interface->mVerts->x +
                          (ulong)(piVar4[1] * mesh_interface->mVertexStride));
        pfVar7 = (float *)((long)&mesh_interface->mVerts->x +
                          (ulong)(piVar4[2] * mesh_interface->mVertexStride));
        fVar1 = *pfVar5;
        fVar2 = *pfVar6;
        local_58c = *pfVar7;
        if (fVar2 <= fVar1) {
          if (fVar2 < local_58c) {
            local_58c = fVar2;
          }
          local_588 = local_58c;
        }
        else {
          local_584 = local_58c;
          if (fVar1 < local_58c) {
            local_584 = fVar1;
          }
          local_588 = local_584;
        }
        Max_.y = local_588;
        local_598 = *pfVar5;
        local_590 = *pfVar6;
        fVar1 = *pfVar7;
        if (local_590 <= local_598) {
          if (local_598 < fVar1) {
            local_598 = fVar1;
          }
          local_594 = local_598;
        }
        else {
          if (local_590 < fVar1) {
            local_590 = fVar1;
          }
          local_594 = local_590;
        }
        Current._4_4_ = local_594;
        fVar1 = pfVar5[1];
        fVar2 = pfVar6[1];
        local_5a4 = pfVar7[1];
        if (fVar2 <= fVar1) {
          if (fVar2 < local_5a4) {
            local_5a4 = fVar2;
          }
          local_5a0 = local_5a4;
        }
        else {
          local_59c = local_5a4;
          if (fVar1 < local_5a4) {
            local_59c = fVar1;
          }
          local_5a0 = local_59c;
        }
        Max_.z = local_5a0;
        local_5b0 = pfVar5[1];
        local_5a8 = pfVar6[1];
        fVar1 = pfVar7[1];
        if (local_5a8 <= local_5b0) {
          if (local_5b0 < fVar1) {
            local_5b0 = fVar1;
          }
          local_5ac = local_5b0;
        }
        else {
          if (local_5a8 < fVar1) {
            local_5a8 = fVar1;
          }
          local_5ac = local_5a8;
        }
        Index = (udword)local_5ac;
        local_5c8 = pfVar5[2];
        local_5c0 = pfVar6[2];
        fVar1 = pfVar7[2];
        if (local_5c0 <= local_5c8) {
          if (local_5c8 < fVar1) {
            local_5c8 = fVar1;
          }
          local_5c4 = local_5c8;
        }
        else {
          if (local_5c0 < fVar1) {
            local_5c0 = fVar1;
          }
          local_5c4 = local_5c0;
        }
        Max_.x = local_5c4;
      }
      if (Max_.y <= Max.y) {
        local_5d4 = Max_.y;
      }
      else {
        local_5d4 = Max.y;
      }
      if (Current._4_4_ <= (float)local_4b8) {
        local_5dc = (float)local_4b8;
      }
      else {
        local_5dc = Current._4_4_;
      }
      if (Max_.z <= Max.z) {
        local_5e4 = Max_.z;
      }
      else {
        local_5e4 = Max.z;
      }
      if ((float)Index <= local_4b8._4_4_) {
        local_5ec = local_4b8._4_4_;
      }
      else {
        local_5ec = (float)Index;
      }
      if (Min_.x <= Min.x) {
        local_5f4 = Min_.x;
      }
      else {
        local_5f4 = Min.x;
      }
      Min.x = local_5f4;
      if (Max_.x <= Max.x) {
        local_5fc = Max.x;
      }
      else {
        local_5fc = Max_.x;
      }
      local_2cc._0_4_ = (local_5dc + local_5d4) * 0.5;
      local_2cc._4_4_ = (local_5ec + local_5e4) * 0.5;
      (pAVar3->mAABB).mCenter.x = (float)local_2cc;
      (pAVar3->mAABB).mCenter.y = local_2cc._4_4_;
      (pAVar3->mAABB).mCenter.z = (local_5fc + local_5f4) * 0.5;
      local_2f0._0_4_ = (local_5dc - local_5d4) * 0.5;
      local_2f0._4_4_ = (local_5ec - local_5e4) * 0.5;
      (pAVar3->mAABB).mExtents.x = (float)local_2f0;
      (pAVar3->mAABB).mExtents.y = local_2f0._4_4_;
      (pAVar3->mAABB).mExtents.z = (local_5fc - local_5f4) * 0.5;
      Current._0_4_ = (uint)Current - 1;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AABBNoLeafTree::Refit(const MeshInterface* mesh_interface)
{
	// Checkings
	if(!mesh_interface)	return false;

	// Bottom-up update
	VertexPointers VP;
	Point Min,Max;
	Point Min_,Max_;
	udword Index = mNbNodes;
	while(Index--)
	{
		AABBNoLeafNode& Current = mNodes[Index];

		if(Current.HasPosLeaf())
		{
			mesh_interface->GetTriangle(VP, Current.GetPosPrimitive());
			ComputeMinMax(Min, Max, VP);
		}
		else
		{
			const CollisionAABB& CurrentBox = Current.GetPos()->mAABB;
			CurrentBox.GetMin(Min);
			CurrentBox.GetMax(Max);
		}

		if(Current.HasNegLeaf())
		{
			mesh_interface->GetTriangle(VP, Current.GetNegPrimitive());
			ComputeMinMax(Min_, Max_, VP);
		}
		else
		{
			const CollisionAABB& CurrentBox = Current.GetNeg()->mAABB;
			CurrentBox.GetMin(Min_);
			CurrentBox.GetMax(Max_);
		}
#ifdef OPC_USE_FCOMI
		Min.x = FCMin2(Min.x, Min_.x);
		Max.x = FCMax2(Max.x, Max_.x);
		Min.y = FCMin2(Min.y, Min_.y);
		Max.y = FCMax2(Max.y, Max_.y);
		Min.z = FCMin2(Min.z, Min_.z);
		Max.z = FCMax2(Max.z, Max_.z);
#else
		Min.Min(Min_);
		Max.Max(Max_);
#endif
		Current.mAABB.SetMinMax(Min, Max);
	}
	return true;
}